

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O0

void __thiscall
trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::seed<trng::minstd>
          (lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *this,minstd *g)

{
  result_type rVar1;
  long in_RDI;
  int j;
  result_type_conflict r;
  uint i;
  result_type in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  for (local_14 = 0; local_14 < 0x209; local_14 = local_14 + 1) {
    local_18 = 0;
    for (local_1c = 0; local_1c < 0x20; local_1c = local_1c + 1) {
      local_18 = local_18 * 2;
      in_stack_ffffffffffffffd0 =
           minstd::operator()((minstd *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      rVar1 = minstd::min();
      in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd0 - rVar1;
      rVar1 = minstd::max();
      if (rVar1 >> 1 < in_stack_ffffffffffffffd4) {
        local_18 = local_18 + 1;
      }
    }
    *(int *)(in_RDI + (ulong)local_14 * 4) = local_18;
  }
  *(undefined4 *)(in_RDI + 0x1000) = 0x208;
  return;
}

Assistant:

void seed(gen &g) {
      for (unsigned int i{0}; i < D; ++i) {
        result_type r{0};
        for (int j{0}; j < std::numeric_limits<result_type>::digits; ++j) {
          r <<= 1;
          if (g() - gen::min() > gen::max() / 2)
            ++r;
        }
        S.r[i] = r;
      }
      S.index = D - 1;
    }